

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

bool __thiscall duckdb::FileSystem::IsPathAbsolute(FileSystem *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  string path_separator;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (*this->_vptr_FileSystem[0x18])(local_40,this,path);
  lVar3 = ::std::__cxx11::string::rfind((char *)path,(ulong)local_40[0],0);
  bVar4 = true;
  if (lVar3 != 0) {
    local_80 = local_70;
    pcVar1 = (path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
    local_60 = local_50;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"file:/","");
    if (local_78 < local_58) {
      bVar4 = false;
    }
    else if (local_58 != 0) {
      iVar2 = bcmp(local_60,local_80,local_58);
      bVar4 = iVar2 == 0;
    }
  }
  if (lVar3 != 0) {
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return bVar4;
}

Assistant:

bool FileSystem::IsPathAbsolute(const string &path) {
	auto path_separator = PathSeparator(path);
	return PathMatched(path, path_separator) || StringUtil::StartsWith(path, "file:/");
}